

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O3

void dump_mmt_buf_as_words(mmt_buf *buf)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  ulong uVar4;
  
  uVar1 = buf->len;
  if (3 < uVar1) {
    uVar4 = 0;
    do {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         0x%08x\n",(ulong)buf[uVar4 + 1].len);
      }
      else {
        fprintf(_stdout,"%64s        0x%08x\n"," ");
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      uVar4 = uVar4 + 1;
      uVar1 = buf->len;
    } while (uVar4 < uVar1 >> 2);
  }
  uVar2 = uVar1 & 0xfffffffc;
  if (uVar2 != uVar1) {
    pbVar3 = (byte *)((long)&buf[1].len + (long)(int)uVar2);
    do {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         0x%02x\n",(ulong)*pbVar3);
      }
      else {
        fprintf(_stdout,"%64s        0x%02x\n"," ");
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      pbVar3 = pbVar3 + 1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < buf->len);
  }
  return;
}

Assistant:

void dump_mmt_buf_as_words(struct mmt_buf *buf)
{
	int j;
	for (j = 0; j < buf->len / 4; ++j)
		mmt_log("        0x%08x\n", ((uint32_t *)buf->data)[j]);
	for (j = buf->len / 4 * 4; j < buf->len; ++j)
		mmt_log("        0x%02x\n", buf->data[j]);
}